

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

void __thiscall Shortcut_Button::draw(Shortcut_Button *this)

{
  uint shortcut;
  int iVar1;
  char *str;
  char *pcVar2;
  int w;
  Fl_Color c;
  int y;
  Fl_Boxtype t;
  int h;
  char buf [1024];
  
  str = buf;
  if ((this->super_Fl_Button).value_ == '\0') {
    t = FL_UP_BOX;
    c = 0xff;
  }
  else {
    t = FL_DOWN_BOX;
    c = 9;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,t,c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])(fl_graphics_driver,0,0xe);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0);
  shortcut = this->svalue;
  if ((shortcut & 0x440000) == 0 || use_FL_COMMAND == 0) {
    str = fl_shortcut_label(shortcut);
    iVar1 = (this->super_Fl_Button).super_Fl_Widget.x_;
    y = (this->super_Fl_Button).super_Fl_Widget.y_;
    w = (this->super_Fl_Button).super_Fl_Widget.w_;
    h = (this->super_Fl_Button).super_Fl_Widget.h_;
  }
  else {
    pcVar2 = fl_shortcut_label(shortcut & 0xffbbffff);
    fl_snprintf(buf,0x3ff,"Command+%s",pcVar2);
    iVar1 = (this->super_Fl_Button).super_Fl_Widget.x_;
    y = (this->super_Fl_Button).super_Fl_Widget.y_;
    w = (this->super_Fl_Button).super_Fl_Widget.w_;
    h = (this->super_Fl_Button).super_Fl_Widget.h_;
  }
  fl_draw(str,iVar1 + 6,y,w,h,4,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Shortcut_Button::draw() {
  if (value()) draw_box(FL_DOWN_BOX, (Fl_Color)9);
  else draw_box(FL_UP_BOX, FL_WHITE);
  fl_font(FL_HELVETICA,14); fl_color(FL_FOREGROUND_COLOR);
	if (use_FL_COMMAND && (svalue & (FL_CTRL|FL_META))) {
		char buf[1024];
		fl_snprintf(buf, 1023, "Command+%s", fl_shortcut_label(svalue&~(FL_CTRL|FL_META)));
		fl_draw(buf,x()+6,y(),w(),h(),FL_ALIGN_LEFT);
	} else {
		fl_draw(fl_shortcut_label(svalue),x()+6,y(),w(),h(),FL_ALIGN_LEFT);
	}
}